

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O1

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::visitStmt
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,BlockStatement *stmt)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  byte bVar3;
  byte bVar4;
  undefined4 uVar5;
  group_type_pointer pgVar6;
  Statement *this_00;
  size_type sVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  size_t sVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  value_type_pointer ctx;
  StatementBlockSymbol *pSVar16;
  value_type_pointer ppVar17;
  DataFlowState *pDVar18;
  ulong hash;
  group15<boost::unordered::detail::foa::plain_integral> *pg;
  slot_type *psVar19;
  Statement **ppSVar20;
  DataFlowState *branchState;
  ulong uVar21;
  long lVar22;
  pointer other;
  bool bVar23;
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  try_emplace_args_t local_391;
  StatementSyntax *local_390;
  DataFlowState *local_388;
  Statement *stmtPtr;
  DataFlowState *local_378;
  BlockStatement *local_370;
  locator res;
  group15<boost::unordered::detail::foa::plain_integral> local_350 [8];
  bool local_2d0;
  DataFlowState local_2c8;
  DataFlowState currState;
  DataFlowState local_d0;
  
  pSVar16 = stmt->blockSymbol;
  if (pSVar16 != (StatementBlockSymbol *)0x0) {
    ppVar17 = (value_type_pointer)&this->disableBranches;
    currState.assigned.super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
    .data_ = (pointer)currState.assigned.
                      super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                      firstElement;
    currState.assigned.super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
    .len = 0;
    currState.assigned.super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
    .cap = 2;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = pSVar16;
    hash = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar12 = hash >> ((byte)(this->disableBranches).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
                            .arrays.groups_size_index & 0x3f);
    pgVar6 = (this->disableBranches).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
             .arrays.groups_;
    uVar5 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    ctx = (this->disableBranches).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
          .arrays.elements_;
    local_378 = (DataFlowState *)
                (this->disableBranches).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
                .arrays.groups_size_mask;
    pDVar18 = (DataFlowState *)0x0;
    uVar21 = uVar12;
    do {
      local_388 = pDVar18;
      pgVar2 = pgVar6 + uVar21;
      uVar24 = (uchar)uVar5;
      auVar28[0] = -(pgVar2->m[0].n == uVar24);
      uVar25 = (uchar)((uint)uVar5 >> 8);
      auVar28[1] = -(pgVar2->m[1].n == uVar25);
      uVar26 = (uchar)((uint)uVar5 >> 0x10);
      auVar28[2] = -(pgVar2->m[2].n == uVar26);
      uVar27 = (uchar)((uint)uVar5 >> 0x18);
      auVar28[3] = -(pgVar2->m[3].n == uVar27);
      auVar28[4] = -(pgVar2->m[4].n == uVar24);
      auVar28[5] = -(pgVar2->m[5].n == uVar25);
      auVar28[6] = -(pgVar2->m[6].n == uVar26);
      auVar28[7] = -(pgVar2->m[7].n == uVar27);
      auVar28[8] = -(pgVar2->m[8].n == uVar24);
      auVar28[9] = -(pgVar2->m[9].n == uVar25);
      auVar28[10] = -(pgVar2->m[10].n == uVar26);
      auVar28[0xb] = -(pgVar2->m[0xb].n == uVar27);
      auVar28[0xc] = -(pgVar2->m[0xc].n == uVar24);
      auVar28[0xd] = -(pgVar2->m[0xd].n == uVar25);
      auVar28[0xe] = -(pgVar2->m[0xe].n == uVar26);
      auVar28[0xf] = -(pgVar2->m[0xf].n == uVar27);
      for (uVar14 = (uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe);
          local_390 = (StatementSyntax *)ppVar17, stmtPtr = (Statement *)pSVar16, uVar14 != 0;
          uVar14 = uVar14 - 1 & uVar14) {
        uVar8 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        if (pSVar16 == (StatementBlockSymbol *)ctx[uVar21 * 0xf + (ulong)uVar8].first) {
          if (ctx + uVar21 * 0xf + (ulong)uVar8 != (value_type_pointer)0x0) goto LAB_002d1723;
          goto LAB_002d16d6;
        }
      }
      if ((pgVar6[uVar21].m[0xf].n &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
      pDVar18 = (DataFlowState *)
                ((long)&(local_388->assigned).
                        super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
                        .data_ + 1);
      uVar21 = (ulong)((local_388->assigned).
                       super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
                       .firstElement + (uVar21 - 0x17)) & (ulong)local_378;
    } while (pDVar18 <= local_378);
LAB_002d16d6:
    if ((this->disableBranches).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
        .size_ctrl.size <
        (this->disableBranches).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<slang::analysis::DataFlowState,2ul>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>
                (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<slang::analysis::DataFlowState,2ul>>>>
                       *)ppVar17,(arrays_type *)ppVar17,uVar12,hash,&local_391,(Symbol **)&stmtPtr,
                 (SmallVector<slang::analysis::DataFlowState,_2UL> *)&currState);
      psVar1 = &(this->disableBranches).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
      ctx = ppVar17;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<slang::analysis::DataFlowState,2ul>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>
                (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<slang::analysis::DataFlowState,2ul>>>>
                       *)ppVar17,hash,&local_391,(Symbol **)&stmtPtr,
                 (SmallVector<slang::analysis::DataFlowState,_2UL> *)&currState);
      ctx = ppVar17;
    }
LAB_002d1723:
    SmallVectorBase<slang::analysis::DataFlowState>::cleanup
              ((SmallVectorBase<slang::analysis::DataFlowState> *)&currState,(EVP_PKEY_CTX *)ctx);
  }
  if (stmt->blockKind == Sequential) {
    ast::Statement::visit<slang::analysis::DataFlowAnalysis&>(stmt->body,(DataFlowAnalysis *)this);
  }
  else {
    stmtPtr = stmt->body;
    if (stmtPtr->kind == List) {
      ppSVar20 = *(Statement ***)(stmtPtr + 1);
      local_390 = stmtPtr[1].syntax;
    }
    else {
      ppSVar20 = &stmtPtr;
      local_390 = (StatementSyntax *)0x1;
    }
    local_370 = stmt;
    if (local_390 == (StatementSyntax *)0x0) {
      lVar22 = 0;
    }
    else {
      lVar13 = (long)local_390 * 8;
      lVar22 = 0;
      lVar15 = 0;
      do {
        if ((*(Statement **)((long)ppSVar20 + lVar15))->kind != VariableDeclaration) break;
        ast::Statement::visit<slang::analysis::DataFlowAnalysis&>
                  (*(Statement **)((long)ppSVar20 + lVar15),(DataFlowAnalysis *)this);
        lVar22 = lVar22 + 1;
        bVar23 = lVar13 + -8 != lVar15;
        lVar15 = lVar15 + 8;
      } while (bVar23);
    }
    pDVar18 = &this->state;
    DataFlowAnalysis::copyState(&currState,(DataFlowAnalysis *)this,pDVar18);
    local_388 = pDVar18;
    SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL>::SmallVector
              ((SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL> *)&res,
               (Base *)pDVar18);
    stmt = local_370;
    local_2d0 = (this->state).reachable;
    local_378 = (DataFlowState *)((long)local_390 - lVar22);
    if ((DataFlowState *)((long)local_390 - lVar22) != (DataFlowState *)0x0) {
      lVar22 = lVar22 << 3;
      local_390 = (StatementSyntax *)((long)local_390 << 3);
      do {
        this_00 = *(Statement **)((long)ppSVar20 + lVar22);
        DataFlowAnalysis::copyState(&local_2c8,(DataFlowAnalysis *)this,&currState);
        setState(this,&local_2c8);
        if (local_2c8.assigned.
            super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ !=
            (pointer)local_2c8.assigned.
                     super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                     firstElement) {
          operator_delete(local_2c8.assigned.
                          super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
                          .data_);
        }
        ast::Statement::visit<slang::analysis::DataFlowAnalysis&>(this_00,(DataFlowAnalysis *)this);
        if (stmt->blockKind == JoinAll) {
LAB_002d1879:
          DataFlowAnalysis::meetState((DataFlowAnalysis *)this,(DataFlowState *)&res,local_388);
        }
        else if (stmt->blockKind == JoinAny) {
          if (local_378 == (DataFlowState *)0x1) goto LAB_002d1879;
          DataFlowAnalysis::joinState((DataFlowAnalysis *)this,(DataFlowState *)&res,local_388);
        }
        lVar22 = lVar22 + 8;
      } while (local_390 != (StatementSyntax *)lVar22);
    }
    SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL>::SmallVector
              (&local_d0.assigned,(Base *)&res);
    local_d0.reachable = local_2d0;
    setState(this,&local_d0);
    if (local_d0.assigned.
        super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ !=
        (pointer)local_d0.assigned.
                 super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                 firstElement) {
      operator_delete(local_d0.assigned.
                      super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                      data_);
    }
    if (res.pg != local_350) {
      operator_delete(res.pg);
    }
    if (currState.assigned.
        super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ !=
        (pointer)currState.assigned.
                 super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                 firstElement) {
      operator_delete(currState.assigned.
                      super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                      data_);
    }
  }
  pSVar16 = stmt->blockSymbol;
  if (pSVar16 == (StatementBlockSymbol *)0x0) {
    return;
  }
  auVar10._8_8_ = 0;
  auVar10._0_8_ = pSVar16;
  uVar12 = SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar21 = uVar12 >> ((byte)(this->disableBranches).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  pgVar6 = (this->disableBranches).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
           .arrays.groups_;
  uVar5 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar12 & 0xff];
  ppVar17 = (this->disableBranches).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
            .arrays.elements_;
  local_390 = (StatementSyntax *)
              (this->disableBranches).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
              .arrays.groups_size_mask;
  lVar22 = 0;
  do {
    pgVar2 = pgVar6 + uVar21;
    uVar24 = (uchar)uVar5;
    auVar29[0] = -(pgVar2->m[0].n == uVar24);
    uVar25 = (uchar)((uint)uVar5 >> 8);
    auVar29[1] = -(pgVar2->m[1].n == uVar25);
    uVar26 = (uchar)((uint)uVar5 >> 0x10);
    auVar29[2] = -(pgVar2->m[2].n == uVar26);
    uVar27 = (uchar)((uint)uVar5 >> 0x18);
    auVar29[3] = -(pgVar2->m[3].n == uVar27);
    auVar29[4] = -(pgVar2->m[4].n == uVar24);
    auVar29[5] = -(pgVar2->m[5].n == uVar25);
    auVar29[6] = -(pgVar2->m[6].n == uVar26);
    auVar29[7] = -(pgVar2->m[7].n == uVar27);
    auVar29[8] = -(pgVar2->m[8].n == uVar24);
    auVar29[9] = -(pgVar2->m[9].n == uVar25);
    auVar29[10] = -(pgVar2->m[10].n == uVar26);
    auVar29[0xb] = -(pgVar2->m[0xb].n == uVar27);
    auVar29[0xc] = -(pgVar2->m[0xc].n == uVar24);
    auVar29[0xd] = -(pgVar2->m[0xd].n == uVar25);
    auVar29[0xe] = -(pgVar2->m[0xe].n == uVar26);
    auVar29[0xf] = -(pgVar2->m[0xf].n == uVar27);
    for (uVar14 = (uint)(ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe); uVar14 != 0;
        uVar14 = uVar14 - 1 & uVar14) {
      uVar8 = 0;
      if (uVar14 != 0) {
        for (; (uVar14 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
        }
      }
      if (pSVar16 == (StatementBlockSymbol *)ppVar17[uVar21 * 0xf + (ulong)uVar8].first) {
        psVar19 = pgVar6[uVar21].m + uVar8;
        sVar7 = ppVar17[uVar21 * 0xf + (ulong)uVar8].second.
                super_SmallVectorBase<slang::analysis::DataFlowState>.len;
        if (sVar7 != 0) {
          other = ppVar17[uVar21 * 0xf + (ulong)uVar8].second.
                  super_SmallVectorBase<slang::analysis::DataFlowState>.data_;
          lVar22 = sVar7 * 0xa0;
          do {
            pSVar16 = (StatementBlockSymbol *)&this->state;
            DataFlowAnalysis::joinState((DataFlowAnalysis *)this,&this->state,other);
            other = other + 1;
            lVar22 = lVar22 + -0xa0;
          } while (lVar22 != 0);
        }
        SmallVectorBase<slang::analysis::DataFlowState>::cleanup
                  (&ppVar17[uVar21 * 0xf + (ulong)uVar8].second.
                    super_SmallVectorBase<slang::analysis::DataFlowState>,(EVP_PKEY_CTX *)pSVar16);
        bVar3 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::
                  is_not_overflowed(unsigned_long)::shift)[psVar19->n & 7];
        bVar4 = *(byte *)((ulong)psVar19 | 0xf);
        psVar19->n = '\0';
        sVar11 = (this->disableBranches).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
                 .size_ctrl.size;
        (this->disableBranches).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
        .size_ctrl.ml =
             (this->disableBranches).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
             .size_ctrl.ml - (ulong)((bVar3 & bVar4) != 0);
        (this->disableBranches).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
        .size_ctrl.size = sVar11 - 1;
        return;
      }
    }
    lVar13 = uVar21 + lVar22;
    lVar22 = lVar22 + 1;
    uVar21 = lVar13 + 1U & (ulong)local_390;
  } while( true );
}

Assistant:

void visitStmt(const BlockStatement& stmt) {
        // This block could be the target of a disable statement.
        if (stmt.blockSymbol) {
            auto [it, inserted] = disableBranches.try_emplace(stmt.blockSymbol,
                                                              SmallVector<TState>{});
            SLANG_ASSERT(inserted);
        }

        if (stmt.blockKind == StatementBlockKind::Sequential) {
            visit(stmt.body);
        }
        else {
            auto stmtPtr = &stmt.body;
            auto statements = stmt.body.kind == StatementKind::List
                                  ? stmt.body.as<StatementList>().list
                                  : std::span(&stmtPtr, 1);
            size_t numLocalDecls = 0;
            for (auto s : statements) {
                // Variable declaration initializers happen before
                // we fork the remaining statements.
                if (s->kind == StatementKind::VariableDeclaration) {
                    visit(*s);
                    numLocalDecls++;
                }
                else {
                    break;
                }
            }
            statements = statements.subspan(numLocalDecls);

            // Each remaining statement is executed in parallel.
            auto currState = (DERIVED).copyState(state);
            auto finalState = std::move(state);
            for (auto s : statements) {
                setState((DERIVED).copyState(currState));
                visit(*s);

                switch (stmt.blockKind) {
                    case StatementBlockKind::JoinAny:
                        // If there's only one statement (a pathological case)
                        // then we can meet it; otherwise we must join since
                        // there is uncertainty about which path was taken.
                        if (statements.size() == 1)
                            (DERIVED).meetState(finalState, state);
                        else
                            (DERIVED).joinState(finalState, state);
                        break;
                    case StatementBlockKind::JoinAll:
                        // All paths must be taken, so we meet the states.
                        (DERIVED).meetState(finalState, state);
                        break;
                    case StatementBlockKind::JoinNone:
                        // No paths will be taken by the time the fork
                        // moves on so we discard this state.
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
            }
            setState(std::move(finalState));
        }

        // Once we're done with a block we remove it as a disable target.
        // A disable statement can target any block in the hierarchy but
        // we don't analyze the control flow implications for targets that
        // aren't part of the current execution stack.
        if (stmt.blockSymbol) {
            auto it = disableBranches.find(stmt.blockSymbol);
            SLANG_ASSERT(it != disableBranches.end());

            for (auto& branchState : it->second)
                (DERIVED).joinState(state, branchState);

            disableBranches.erase(it);
        }
    }